

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O3

int32_t uloc_getKeywordValue_63
                  (char *localeID,char *keywordName,char *buffer,int32_t bufferCapacity,
                  UErrorCode *status)

{
  char *pcVar1;
  long lVar2;
  UBool UVar3;
  char cVar4;
  int32_t iVar5;
  int iVar6;
  uint uVar7;
  int32_t iVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sVar12;
  long lVar13;
  char localeKeywordNameBuffer [25];
  char keywordNameBuffer [25];
  char tempBuffer [157];
  char local_118 [32];
  char local_f8 [32];
  char local_d8 [168];
  
  iVar8 = 0;
  if (((status != (UErrorCode *)0x0) && (localeID != (char *)0x0)) &&
     (iVar8 = 0, *status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((keywordName == (char *)0x0) || (*keywordName == '\0')) {
LAB_001b8d52:
      *status = U_ILLEGAL_ARGUMENT_ERROR;
LAB_001b8d58:
      iVar8 = 0;
    }
    else {
      locale_canonKeywordName(local_f8,keywordName,status);
      iVar8 = 0;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        pcVar9 = strchr(localeID,0x40);
        pcVar10 = localeID;
        if ((pcVar9 == (char *)0x0) && (iVar5 = getShortestSubtagLength(localeID), iVar5 == 1)) {
          iVar5 = uloc_forLanguageTag_63(localeID,local_d8,0x9d,(int32_t *)0x0,status);
          pcVar9 = localeID;
          if (((iVar5 < 1) || (pcVar9 = local_d8, *status < U_ILLEGAL_ARGUMENT_ERROR)) &&
             (pcVar10 = pcVar9, *status == U_STRING_NOT_TERMINATED_WARNING)) {
            *status = U_BUFFER_OVERFLOW_ERROR;
            pcVar10 = localeID;
          }
        }
        pcVar10 = strchr(pcVar10,0x40);
        if (pcVar10 != (char *)0x0) {
          do {
            if (pcVar10 == (char *)0x0) goto LAB_001b8d58;
            pcVar9 = strchr(pcVar10 + 1,0x3d);
            if (pcVar9 == (char *)0x0) goto LAB_001b8d52;
            do {
              pcVar11 = pcVar10 + 1;
              pcVar10 = pcVar10 + 1;
              pcVar1 = pcVar9;
            } while (*pcVar11 == ' ');
            do {
              pcVar11 = pcVar1;
              if (pcVar11 <= pcVar10) {
                if (pcVar11 == pcVar10) goto LAB_001b8d52;
                lVar13 = 0;
                goto LAB_001b8c69;
              }
              pcVar1 = pcVar11 + -1;
            } while (pcVar11[-1] == ' ');
            lVar13 = 0;
            do {
              UVar3 = uprv_isASCIILetter_63(pcVar10[lVar13]);
              if ((UVar3 == '\0') && (9 < (byte)(pcVar10[lVar13] - 0x30U))) goto LAB_001b8d52;
              if (lVar13 == 0x18) {
                *status = U_INTERNAL_PROGRAM_ERROR;
                goto LAB_001b8d58;
              }
              pcVar1 = pcVar10 + lVar13;
              cVar4 = uprv_asciitolower_63(*pcVar1);
              local_118[lVar13] = cVar4;
              lVar13 = lVar13 + 1;
            } while (pcVar1 + 1 < pcVar11);
LAB_001b8c69:
            local_118[lVar13] = '\0';
            pcVar10 = strchr(pcVar9,0x3b);
            iVar6 = strcmp(local_f8,local_118);
          } while (iVar6 != 0);
          do {
            pcVar11 = pcVar9 + 1;
            pcVar9 = pcVar9 + 1;
          } while (*pcVar11 == ' ');
          if (pcVar10 == (char *)0x0) {
            sVar12 = strlen(pcVar9);
            pcVar10 = pcVar9 + sVar12;
          }
          do {
            pcVar11 = pcVar10;
            if (pcVar11 <= pcVar9) {
              lVar13 = 0;
              if (pcVar9 == pcVar11) goto LAB_001b8d52;
              goto LAB_001b8d3b;
            }
            pcVar10 = pcVar11 + -1;
          } while (pcVar11[-1] == ' ');
          lVar13 = 0;
          do {
            UVar3 = uprv_isASCIILetter_63(pcVar9[lVar13]);
            if (((UVar3 == '\0') && (9 < (byte)(pcVar9[lVar13] - 0x30U))) &&
               ((uVar7 = (byte)pcVar9[lVar13] - 0x2b, 0x34 < uVar7 ||
                ((0x10000000000015U >> ((ulong)uVar7 & 0x3f) & 1) == 0)))) goto LAB_001b8d52;
            if (lVar13 < bufferCapacity) {
              buffer[lVar13] = pcVar9[lVar13];
            }
            lVar2 = lVar13 + 1;
            lVar13 = lVar13 + 1;
          } while (pcVar9 + lVar2 < pcVar11);
LAB_001b8d3b:
          iVar8 = u_terminateChars_63(buffer,bufferCapacity,(int32_t)lVar13,status);
        }
      }
    }
  }
  return iVar8;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_getKeywordValue(const char* localeID,
                     const char* keywordName,
                     char* buffer, int32_t bufferCapacity,
                     UErrorCode* status)
{
    const char* startSearchHere = NULL;
    const char* nextSeparator = NULL;
    char keywordNameBuffer[ULOC_KEYWORD_BUFFER_LEN];
    char localeKeywordNameBuffer[ULOC_KEYWORD_BUFFER_LEN];
    int32_t result = 0;

    if(status && U_SUCCESS(*status) && localeID) {
      char tempBuffer[ULOC_FULLNAME_CAPACITY];
      const char* tmpLocaleID;

      if (keywordName == NULL || keywordName[0] == 0) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
      }

      locale_canonKeywordName(keywordNameBuffer, keywordName, status);
      if(U_FAILURE(*status)) {
        return 0;
      }

      if (_hasBCP47Extension(localeID)) {
          _ConvertBCP47(tmpLocaleID, localeID, tempBuffer, sizeof(tempBuffer), status);
      } else {
          tmpLocaleID=localeID;
      }

      startSearchHere = locale_getKeywordsStart(tmpLocaleID);
      if(startSearchHere == NULL) {
          /* no keywords, return at once */
          return 0;
      }

      /* find the first keyword */
      while(startSearchHere) {
          const char* keyValueTail;
          int32_t keyValueLen;

          startSearchHere++; /* skip @ or ; */
          nextSeparator = uprv_strchr(startSearchHere, '=');
          if(!nextSeparator) {
              *status = U_ILLEGAL_ARGUMENT_ERROR; /* key must have =value */
              return 0;
          }
          /* strip leading & trailing spaces (TC decided to tolerate these) */
          while(*startSearchHere == ' ') {
              startSearchHere++;
          }
          keyValueTail = nextSeparator;
          while (keyValueTail > startSearchHere && *(keyValueTail-1) == ' ') {
              keyValueTail--;
          }
          /* now keyValueTail points to first char after the keyName */
          /* copy & normalize keyName from locale */
          if (startSearchHere == keyValueTail) {
              *status = U_ILLEGAL_ARGUMENT_ERROR; /* empty keyword name in passed-in locale */
              return 0;
          }
          keyValueLen = 0;
          while (startSearchHere < keyValueTail) {
            if (!UPRV_ISALPHANUM(*startSearchHere)) {
              *status = U_ILLEGAL_ARGUMENT_ERROR; /* malformed keyword name */
              return 0;
            }
            if (keyValueLen < ULOC_KEYWORD_BUFFER_LEN - 1) {
              localeKeywordNameBuffer[keyValueLen++] = uprv_tolower(*startSearchHere++);
            } else {
              /* keyword name too long for internal buffer */
              *status = U_INTERNAL_PROGRAM_ERROR;
              return 0;
            }
          }
          localeKeywordNameBuffer[keyValueLen] = 0; /* terminate */

          startSearchHere = uprv_strchr(nextSeparator, ';');

          if(uprv_strcmp(keywordNameBuffer, localeKeywordNameBuffer) == 0) {
               /* current entry matches the keyword. */
             nextSeparator++; /* skip '=' */
              /* First strip leading & trailing spaces (TC decided to tolerate these) */
              while(*nextSeparator == ' ') {
                nextSeparator++;
              }
              keyValueTail = (startSearchHere)? startSearchHere: nextSeparator + uprv_strlen(nextSeparator);
              while(keyValueTail > nextSeparator && *(keyValueTail-1) == ' ') {
                keyValueTail--;
              }
              /* Now copy the value, but check well-formedness */
              if (nextSeparator == keyValueTail) {
                *status = U_ILLEGAL_ARGUMENT_ERROR; /* empty key value name in passed-in locale */
                return 0;
              }
              keyValueLen = 0;
              while (nextSeparator < keyValueTail) {
                if (!UPRV_ISALPHANUM(*nextSeparator) && !UPRV_OK_VALUE_PUNCTUATION(*nextSeparator)) {
                  *status = U_ILLEGAL_ARGUMENT_ERROR; /* malformed key value */
                  return 0;
                }
                if (keyValueLen < bufferCapacity) {
                  /* Should we lowercase value to return here? Tests expect as-is. */
                  buffer[keyValueLen++] = *nextSeparator++;
                } else { /* keep advancing so we return correct length in case of overflow */
                  keyValueLen++;
                  nextSeparator++;
                }
              }
              result = u_terminateChars(buffer, bufferCapacity, keyValueLen, status);
              return result;
          }
      }
    }
    return 0;
}